

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void line_attempt_2(int x0,int y0,int x1,int y1,TGAImage *image,TGAColor color)

{
  long lVar1;
  float fVar2;
  TGAColor local_40;
  float local_38;
  float local_34;
  double local_30;
  
  local_40.bgra = color.bgra;
  local_40.bytespp = color.bytespp;
  if (x0 <= x1) {
    local_34 = (float)(x1 - x0);
    local_30 = (double)y0;
    local_38 = (float)y1;
    lVar1 = 0;
    do {
      fVar2 = (float)(int)lVar1 / local_34;
      TGAImage::set(image,x0 + lVar1,
                    (long)(int)((double)(fVar2 * local_38) + (1.0 - (double)fVar2) * local_30),
                    &local_40);
      lVar1 = lVar1 + 1;
    } while ((x1 - x0) + 1 != (int)lVar1);
  }
  return;
}

Assistant:

void line_attempt_2(int x0, int y0, int x1, int y1, TGAImage &image, TGAColor color)
{
    for (int x = x0; x <= x1; x++) {
        float t = static_cast<float>(x - x0) / static_cast<float>(x1 - x0);
        int y = static_cast<int>(y0 * (1. - t) + static_cast<float>(y1) * t);
        image.set(x, y, color);
    }
}